

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<int>::resize_internal(QList<int> *this,qsizetype newSize)

{
  bool bVar1;
  qsizetype qVar2;
  QPodArrayOps<int> *this_00;
  __off_t __length;
  QArrayDataPointer<int> *in_RSI;
  QArrayDataPointer<int> *in_RDI;
  QArrayDataPointer<int> *in_stack_ffffffffffffffd0;
  QArrayDataPointer<int> *this_01;
  QArrayDataPointer<int> *in_stack_ffffffffffffffd8;
  QArrayDataPointer<int> *in_stack_ffffffffffffffe0;
  QArrayDataPointer<int> *__file;
  
  QArrayDataPointer<int>::operator->(in_RDI);
  bVar1 = QArrayDataPointer<int>::needsDetach(in_stack_ffffffffffffffd0);
  this_01 = in_RSI;
  if (!bVar1) {
    in_stack_ffffffffffffffd8 = (QArrayDataPointer<int> *)capacity((QList<int> *)0x5dc1b1);
    qVar2 = QArrayDataPointer<int>::freeSpaceAtBegin(in_stack_ffffffffffffffd8);
    in_stack_ffffffffffffffe0 = in_RSI;
    if ((long)in_RSI <= (long)in_stack_ffffffffffffffd8 - qVar2) {
      __file = this_01;
      qVar2 = size((QList<int> *)in_RDI);
      if (qVar2 <= (long)this_01) {
        return;
      }
      this_00 = (QPodArrayOps<int> *)QArrayDataPointer<int>::operator->(in_RDI);
      QtPrivate::QPodArrayOps<int>::truncate(this_00,(char *)__file,__length);
      return;
    }
  }
  QArrayDataPointer<int>::detachAndGrow
            (this_01,(GrowthPosition)((ulong)in_RDI >> 0x20),(qsizetype)in_stack_ffffffffffffffe0,
             (int **)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  return;
}

Assistant:

inline void QList<T>::resize_internal(qsizetype newSize)
{
    Q_ASSERT(newSize >= 0);

    if (d->needsDetach() || newSize > capacity() - d.freeSpaceAtBegin()) {
        d.detachAndGrow(QArrayData::GrowsAtEnd, newSize - d.size, nullptr, nullptr);
    } else if (newSize < size()) {
        d->truncate(newSize);
    }
}